

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_perform_effect(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t other;
  wchar_t y;
  wchar_t x;
  wchar_t index_00;
  wchar_t subtype;
  char *fmt;
  source sVar3;
  source origin;
  _Bool ident;
  wchar_t index;
  char dice [80];
  char name [80];
  
  name[0x40] = '\0';
  name[0x41] = '\0';
  name[0x42] = '\0';
  name[0x43] = '\0';
  name[0x44] = '\0';
  name[0x45] = '\0';
  name[0x46] = '\0';
  name[0x47] = '\0';
  name[0x48] = '\0';
  name[0x49] = '\0';
  name[0x4a] = '\0';
  name[0x4b] = '\0';
  name[0x4c] = '\0';
  name[0x4d] = '\0';
  name[0x4e] = '\0';
  name[0x4f] = '\0';
  name[0x30] = '\0';
  name[0x31] = '\0';
  name[0x32] = '\0';
  name[0x33] = '\0';
  name[0x34] = '\0';
  name[0x35] = '\0';
  name[0x36] = '\0';
  name[0x37] = '\0';
  name[0x38] = '\0';
  name[0x39] = '\0';
  name[0x3a] = '\0';
  name[0x3b] = '\0';
  name[0x3c] = '\0';
  name[0x3d] = '\0';
  name[0x3e] = '\0';
  name[0x3f] = '\0';
  name[0x20] = '\0';
  name[0x21] = '\0';
  name[0x22] = '\0';
  name[0x23] = '\0';
  name[0x24] = '\0';
  name[0x25] = '\0';
  name[0x26] = '\0';
  name[0x27] = '\0';
  name[0x28] = '\0';
  name[0x29] = '\0';
  name[0x2a] = '\0';
  name[0x2b] = '\0';
  name[0x2c] = '\0';
  name[0x2d] = '\0';
  name[0x2e] = '\0';
  name[0x2f] = '\0';
  name[0x10] = '\0';
  name[0x11] = '\0';
  name[0x12] = '\0';
  name[0x13] = '\0';
  name[0x14] = '\0';
  name[0x15] = '\0';
  name[0x16] = '\0';
  name[0x17] = '\0';
  name[0x18] = '\0';
  name[0x19] = '\0';
  name[0x1a] = '\0';
  name[0x1b] = '\0';
  name[0x1c] = '\0';
  name[0x1d] = '\0';
  name[0x1e] = '\0';
  name[0x1f] = '\0';
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  dice[8] = '\0';
  dice[9] = '\0';
  dice[10] = '\0';
  dice[0xb] = '\0';
  dice[0xc] = '\0';
  dice[0xd] = '\0';
  dice[0xe] = '\0';
  dice[0xf] = '\0';
  dice[0x40] = '\0';
  dice[0x41] = '\0';
  dice[0x42] = '\0';
  dice[0x43] = '\0';
  dice[0x44] = '\0';
  dice[0x45] = '\0';
  dice[0x46] = '\0';
  dice[0x47] = '\0';
  dice[0x48] = '\0';
  dice[0x49] = '\0';
  dice[0x4a] = '\0';
  dice[0x4b] = '\0';
  dice[0x4c] = '\0';
  dice[0x4d] = '\0';
  dice[0x4e] = '\0';
  dice[0x4f] = '\0';
  dice[0x30] = '\0';
  dice[0x31] = '\0';
  dice[0x32] = '\0';
  dice[0x33] = '\0';
  dice[0x34] = '\0';
  dice[0x35] = '\0';
  dice[0x36] = '\0';
  dice[0x37] = '\0';
  dice[0x38] = '\0';
  dice[0x39] = '\0';
  dice[0x3a] = '\0';
  dice[0x3b] = '\0';
  dice[0x3c] = '\0';
  dice[0x3d] = '\0';
  dice[0x3e] = '\0';
  dice[0x3f] = '\0';
  dice[0x20] = '\0';
  dice[0x21] = '\0';
  dice[0x22] = '\0';
  dice[0x23] = '\0';
  dice[0x24] = '\0';
  dice[0x25] = '\0';
  dice[0x26] = '\0';
  dice[0x27] = '\0';
  dice[0x28] = '\0';
  dice[0x29] = '\0';
  dice[0x2a] = '\0';
  dice[0x2b] = '\0';
  dice[0x2c] = '\0';
  dice[0x2d] = '\0';
  dice[0x2e] = '\0';
  dice[0x2f] = '\0';
  dice[0x10] = '\0';
  dice[0x11] = '\0';
  dice[0x12] = '\0';
  dice[0x13] = '\0';
  dice[0x14] = '\0';
  dice[0x15] = '\0';
  dice[0x16] = '\0';
  dice[0x17] = '\0';
  dice[0x18] = '\0';
  dice[0x19] = '\0';
  dice[0x1a] = '\0';
  dice[0x1b] = '\0';
  dice[0x1c] = '\0';
  dice[0x1d] = '\0';
  dice[0x1e] = '\0';
  dice[0x1f] = '\0';
  dice[0] = '0';
  dice[1] = '\0';
  dice[2] = '\0';
  dice[3] = '\0';
  dice[4] = '\0';
  dice[5] = '\0';
  dice[6] = '\0';
  dice[7] = '\0';
  index = L'\xffffffff';
  ident = false;
  screen_save();
  _Var1 = get_string("Do which effect: ",name,0x50);
  index_00 = L'\xffffffff';
  if (_Var1) {
    _Var1 = get_int_from_string(name,&index);
    if (!_Var1) {
      index = effect_lookup(name);
    }
    index_00 = index;
    if ((uint)(index + L'\xffffff80') < 0xffffff81) {
      fmt = "No effect found.";
      goto LAB_00135811;
    }
  }
  _Var1 = get_string("Enter damage dice (eg 1+2d6M2): ",dice,0x50);
  if (!_Var1) {
    my_strcpy(dice,"0",0x50);
  }
  my_strcpy(name,"0",0x50);
  _Var1 = get_string("Enter name or number for effect subtype: ",name,0x50);
  subtype = L'\0';
  if (_Var1) {
    wVar2 = effect_subtype(index_00,name);
    subtype = L'\0';
    if (wVar2 != L'\xffffffff') {
      subtype = wVar2;
    }
  }
  wVar2 = get_quantity("Enter second parameter (radius): ",L'd');
  other = get_quantity("Enter third parameter (other): ",L'd');
  y = get_quantity("Enter y parameter: ",L'd');
  x = get_quantity("Enter x parameter: ",L'd');
  screen_load();
  sVar3 = source_player();
  origin.which = sVar3.which;
  origin._4_4_ = 0;
  origin.what = sVar3.what;
  effect_simple(index_00,origin,dice,subtype,wVar2,other,y,x,&ident);
  if (ident != true) {
    return;
  }
  fmt = "Identified!";
LAB_00135811:
  msg(fmt);
  return;
}

Assistant:

void do_cmd_wiz_perform_effect(struct command *cmd)
{
	char name[80] = "";
	char dice[80] = "0";
	int index = -1;
	int p1 = 0, p2 = 0, p3 = 0;
	int y = 0, x = 0;
	bool ident = false;

	/* Avoid the prompt getting in the way */
	screen_save();

	/* Get the name */
	if (get_string("Do which effect: ", name, sizeof(name))) {
		/* See if an effect index was entered */
		if (!get_int_from_string(name, &index)) {
			/* If not, find the effect with that name */
			index = effect_lookup(name);
		}

		/* Failed */
		if (index <= EF_NONE || index >= EF_MAX) {
			msg("No effect found.");
			return;
		}
	}

	/* Get the dice */
	if (! get_string("Enter damage dice (eg 1+2d6M2): ", dice,
			sizeof(dice))) {
		my_strcpy(dice, "0", sizeof(dice));
	}

	/* Get the effect subtype */
	my_strcpy(name, "0", sizeof(name));
	if (get_string("Enter name or number for effect subtype: ", name,
			sizeof(name))) {
		/* See if an effect parameter was entered */
		p1 = effect_subtype(index, name);
		if (p1 == -1) p1 = 0;
	}

	/* Get the parameters */
	p2 = get_quantity("Enter second parameter (radius): ", 100);
	p3 = get_quantity("Enter third parameter (other): ", 100);
	y = get_quantity("Enter y parameter: ", 100);
	x = get_quantity("Enter x parameter: ", 100);

	/* Reload the screen */
	screen_load();

	effect_simple(index, source_player(), dice, p1, p2, p3, y, x, &ident);

	if (ident) {
		msg("Identified!");
	}
}